

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_copy_unset_attributes
          (exr_context_t ctxt,int part_index,exr_const_context_t source,int src_part_index)

{
  undefined8 uVar1;
  uint32_t *puVar2;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 aVar3;
  _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *p_Var4;
  _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *p_Var5;
  float fVar6;
  float fVar7;
  exr_result_t eVar8;
  int iVar9;
  exr_result_t eVar10;
  exr_attribute_t *peVar11;
  exr_attribute_t **ppeVar12;
  exr_attr_chromaticities_t *peVar13;
  exr_attr_opaquedata_t *peVar14;
  exr_attribute_type_t type;
  undefined4 in_register_0000000c;
  undefined8 *puVar15;
  float *pfVar16;
  ulong uVar17;
  size_t __n;
  char *pcVar18;
  void *__src;
  exr_attr_box2i_t *__dest;
  code *UNRECOVERED_JUMPTABLE;
  long lVar19;
  int a;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  exr_attribute_t *attr;
  exr_attribute_t *local_e8;
  ulong local_e0;
  exr_attribute_list_t *local_d8;
  int local_cc;
  char *local_c8;
  long local_c0;
  _internal_exr_part *local_b8;
  exr_attribute_t **local_b0;
  exr_attribute_t **local_a8;
  exr_attribute_t **local_a0;
  exr_attribute_t **local_98;
  exr_attribute_t **local_90;
  exr_attribute_t **local_88;
  exr_attribute_t **local_80;
  exr_attribute_t **local_78;
  exr_attribute_t **local_70;
  exr_attribute_t **local_68;
  exr_attribute_t *local_60;
  exr_attr_box2i_t *local_58;
  exr_attr_box2i_t *local_50;
  exr_attribute_t **local_48;
  exr_attribute_t **local_40;
  exr_attribute_t **local_38;
  
  eVar10 = 2;
  if (ctxt != (exr_context_t)0x0) {
    uVar17 = (ulong)(uint)part_index;
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x48);
      pcVar18 = "Part index (%d) out of range";
LAB_0011687b:
      eVar10 = (*UNRECOVERED_JUMPTABLE)(ctxt,4,pcVar18,uVar17,UNRECOVERED_JUMPTABLE);
      return eVar10;
    }
    if (source != (exr_const_context_t)0x0) {
      if ((src_part_index < 0) || (*(int *)(source + 0xc4) <= src_part_index)) {
        UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x48);
        pcVar18 = "Source part index (%d) out of range";
        uVar17 = CONCAT44(in_register_0000000c,src_part_index);
        goto LAB_0011687b;
      }
      local_b8 = *(_internal_exr_part **)(*(long *)(ctxt + 0x1d8) + uVar17 * 8);
      lVar19 = *(long *)(*(long *)(source + 0x1d8) + (ulong)(uint)src_part_index * 8);
      local_d8 = &local_b8->attributes;
      local_68 = &local_b8->version;
      local_a0 = &local_b8->type;
      local_70 = &local_b8->tiles;
      local_a8 = &local_b8->screenWindowWidth;
      local_78 = &local_b8->screenWindowCenter;
      local_80 = &local_b8->pixelAspectRatio;
      local_88 = &local_b8->name;
      local_90 = &local_b8->lineOrder;
      local_40 = &local_b8->displayWindow;
      local_58 = &local_b8->display_window;
      local_38 = &local_b8->dataWindow;
      local_50 = &local_b8->data_window;
      local_b0 = &local_b8->chunkCount;
      local_48 = &local_b8->compression;
      local_98 = &local_b8->channels;
      lVar20 = 0;
      local_cc = 0;
      local_c0 = lVar19;
      do {
        if (*(int *)(lVar19 + 8) <= lVar20) {
          eVar10 = 0;
          break;
        }
        puVar15 = *(undefined8 **)(*(long *)(lVar19 + 0x10) + lVar20 * 8);
        local_60 = (exr_attribute_t *)0x0;
        eVar8 = exr_attr_list_find_by_name(ctxt,local_d8,(char *)*puVar15,&local_60);
        eVar10 = 0;
        if (eVar8 != 0xf) goto LAB_0011683d;
        pcVar18 = (char *)*puVar15;
        local_e8 = (exr_attribute_t *)0x0;
        type = *(exr_attribute_type_t *)((long)puVar15 + 0x14);
        uVar17 = (ulong)type;
        eVar10 = 0x20;
        switch(*pcVar18) {
        case 'c':
          local_e0 = uVar17;
          iVar9 = strcmp(pcVar18,"channels");
          if (iVar9 == 0) {
            type = (exr_attribute_type_t)local_e0;
            eVar10 = exr_attr_list_add_static_name
                               (ctxt,local_d8,"channels",type,0,(uint8_t **)0x0,local_98);
            ppeVar12 = local_98;
          }
          else {
            iVar9 = strcmp(pcVar18,"compression");
            ppeVar12 = local_48;
            if (iVar9 == 0) {
              type = (exr_attribute_type_t)local_e0;
              local_c8 = pcVar18;
              eVar10 = exr_attr_list_add_static_name
                                 (ctxt,local_d8,"compression",type,0,(uint8_t **)0x0,local_48);
              peVar11 = *ppeVar12;
              pcVar18 = local_c8;
              local_e8 = peVar11;
              if (eVar10 == 0) {
                local_b8->comp_type = (uint)*(byte *)(puVar15 + 3);
                goto LAB_00116528;
              }
              goto LAB_001164f0;
            }
            iVar9 = strcmp(pcVar18,"chunkCount");
            if (iVar9 != 0) goto LAB_0011639c;
            type = (exr_attribute_type_t)local_e0;
            eVar10 = exr_attr_list_add_static_name
                               (ctxt,local_d8,"chunkCount",type,0,(uint8_t **)0x0,local_b0);
            ppeVar12 = local_b0;
          }
          break;
        case 'd':
          local_e0 = uVar17;
          iVar9 = strcmp(pcVar18,"dataWindow");
          ppeVar12 = local_38;
          if (iVar9 != 0) {
            local_c8 = pcVar18;
            iVar9 = strcmp(pcVar18,"displayWindow");
            ppeVar12 = local_40;
            type = (exr_attribute_type_t)local_e0;
            if (iVar9 == 0) {
              eVar10 = exr_attr_list_add_static_name
                                 (ctxt,local_d8,"displayWindow",type,0,(uint8_t **)0x0,local_40);
              peVar11 = *ppeVar12;
              pcVar18 = local_c8;
              local_e8 = peVar11;
              if (eVar10 == 0) {
                aVar3 = ((anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)puVar15[3])[1];
                (local_58->min).field_0 =
                     *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)puVar15[3];
                (local_58->max).field_0 = aVar3;
                goto LAB_00116528;
              }
            }
            else {
              peVar11 = (exr_attribute_t *)0x0;
              pcVar18 = local_c8;
            }
            goto LAB_001164f0;
          }
          type = (exr_attribute_type_t)local_e0;
          local_c8 = pcVar18;
          eVar10 = exr_attr_list_add_static_name
                             (ctxt,local_d8,"dataWindow",type,0,(uint8_t **)0x0,local_38);
          peVar11 = *ppeVar12;
          local_e8 = peVar11;
          if (eVar10 != 0) {
            local_cc = 1;
            pcVar18 = local_c8;
            goto LAB_001164f0;
          }
          aVar3 = ((anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)puVar15[3])[1];
          (local_50->min).field_0 = *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)puVar15[3];
          (local_50->max).field_0 = aVar3;
          local_cc = 1;
          goto LAB_00116528;
        case 'e':
        case 'f':
        case 'g':
        case 'h':
        case 'i':
        case 'j':
        case 'k':
        case 'm':
        case 'o':
        case 'q':
        case 'r':
        case 'u':
          peVar11 = (exr_attribute_t *)0x0;
          local_e0 = uVar17;
          goto LAB_001164f0;
        case 'l':
          local_e0 = uVar17;
          iVar9 = strcmp(pcVar18,"lineOrder");
          if (iVar9 == 0) {
            type = (exr_attribute_type_t)local_e0;
            eVar10 = exr_attr_list_add_static_name
                               (ctxt,local_d8,"lineOrder",type,0,(uint8_t **)0x0,local_90);
            peVar11 = *local_90;
            local_e8 = peVar11;
            if (eVar10 == 0) {
              local_b8->lineorder = (uint)*(byte *)(puVar15 + 3);
              goto LAB_00116528;
            }
          }
          else {
LAB_0011639c:
            peVar11 = (exr_attribute_t *)0x0;
            type = (exr_attribute_type_t)local_e0;
          }
          goto LAB_001164f0;
        case 'n':
          local_e0 = uVar17;
          iVar9 = strcmp(pcVar18,"name");
          if (iVar9 != 0) goto LAB_0011639c;
          type = (exr_attribute_type_t)local_e0;
          eVar10 = exr_attr_list_add_static_name
                             (ctxt,local_d8,"name",type,0,(uint8_t **)0x0,local_88);
          ppeVar12 = local_88;
          break;
        case 'p':
          local_e0 = uVar17;
          iVar9 = strcmp(pcVar18,"pixelAspectRatio");
          if (iVar9 != 0) goto LAB_0011639c;
          type = (exr_attribute_type_t)local_e0;
          eVar10 = exr_attr_list_add_static_name
                             (ctxt,local_d8,"pixelAspectRatio",type,0,(uint8_t **)0x0,local_80);
          ppeVar12 = local_80;
          break;
        case 's':
          local_e0 = uVar17;
          iVar9 = strcmp(pcVar18,"screenWindowCenter");
          if (iVar9 == 0) {
            type = (exr_attribute_type_t)local_e0;
            eVar10 = exr_attr_list_add_static_name
                               (ctxt,local_d8,"screenWindowCenter",type,0,(uint8_t **)0x0,local_78);
            ppeVar12 = local_78;
          }
          else {
            iVar9 = strcmp(pcVar18,"screenWindowWidth");
            if (iVar9 != 0) goto LAB_0011639c;
            type = (exr_attribute_type_t)local_e0;
            eVar10 = exr_attr_list_add_static_name
                               (ctxt,local_d8,"screenWindowWidth",type,0,(uint8_t **)0x0,local_a8);
            ppeVar12 = local_a8;
          }
          break;
        case 't':
          local_e0 = uVar17;
          iVar9 = strcmp(pcVar18,"tiles");
          if (iVar9 != 0) {
            iVar9 = strcmp(pcVar18,"type");
            if (iVar9 != 0) goto LAB_0011639c;
            type = (exr_attribute_type_t)local_e0;
            eVar10 = exr_attr_list_add_static_name
                               (ctxt,local_d8,"type",type,0,(uint8_t **)0x0,local_a0);
            ppeVar12 = local_a0;
            break;
          }
          type = (exr_attribute_type_t)local_e0;
          eVar10 = exr_attr_list_add_static_name
                             (ctxt,local_d8,"tiles",type,0,(uint8_t **)0x0,local_70);
          peVar11 = *local_70;
          local_cc = 1;
          local_e8 = peVar11;
          goto LAB_001164f0;
        case 'v':
          local_e0 = uVar17;
          iVar9 = strcmp(pcVar18,"version");
          if (iVar9 != 0) goto LAB_0011639c;
          type = (exr_attribute_type_t)local_e0;
          eVar10 = exr_attr_list_add_static_name
                             (ctxt,local_d8,"version",type,0,(uint8_t **)0x0,local_68);
          ppeVar12 = local_68;
          break;
        default:
          peVar11 = (exr_attribute_t *)0x0;
          goto LAB_001164f0;
        }
        peVar11 = *ppeVar12;
        local_e8 = peVar11;
LAB_001164f0:
        if ((eVar10 == 0x20) && (peVar11 == (exr_attribute_t *)0x0)) {
          eVar10 = exr_attr_list_add(ctxt,local_d8,pcVar18,type,0,(uint8_t **)0x0,&local_e8);
        }
        lVar19 = local_c0;
        if (eVar10 != 0) goto LAB_0011683d;
LAB_00116528:
        lVar19 = local_c0;
        switch(type) {
        case EXR_ATTR_BOX2I:
        case EXR_ATTR_BOX2F:
        case EXR_ATTR_V2D:
          peVar14 = (exr_attr_opaquedata_t *)(local_e8->field_6).chromaticities;
          pfVar16 = (float *)puVar15[3];
          goto LAB_00116660;
        case EXR_ATTR_CHLIST:
          eVar10 = exr_attr_chlist_duplicate
                             (ctxt,(local_e8->field_6).chlist,(exr_attr_chlist_t *)puVar15[3]);
          goto LAB_00116819;
        case EXR_ATTR_CHROMATICITIES:
          peVar14 = (exr_attr_opaquedata_t *)(local_e8->field_6).chromaticities;
          pfVar16 = (float *)puVar15[3];
          goto LAB_00116781;
        case EXR_ATTR_COMPRESSION:
        case EXR_ATTR_ENVMAP:
        case EXR_ATTR_LINEORDER:
          (local_e8->field_6).uc = *(uint8_t *)(puVar15 + 3);
          break;
        case EXR_ATTR_DOUBLE:
          local_e8->field_6 = *(anon_union_8_28_c8f53a7d_for_exr_attribute_t_6 *)(puVar15 + 3);
          break;
        case EXR_ATTR_FLOAT:
          (local_e8->field_6).f = *(float *)(puVar15 + 3);
          break;
        case EXR_ATTR_FLOAT_VECTOR:
          eVar10 = exr_attr_float_vector_create
                             (ctxt,(local_e8->field_6).floatvector,
                              *(float **)((int32_t *)puVar15[3] + 2),*(int32_t *)puVar15[3]);
          goto LAB_00116819;
        case EXR_ATTR_INT:
          (local_e8->field_6).f = *(float *)(puVar15 + 3);
          break;
        case EXR_ATTR_KEYCODE:
          peVar14 = (exr_attr_opaquedata_t *)(local_e8->field_6).chromaticities;
          pfVar16 = (float *)puVar15[3];
          fVar21 = *pfVar16;
          fVar22 = pfVar16[1];
          fVar23 = pfVar16[2];
          fVar24 = pfVar16[3];
          uVar1 = *(undefined8 *)(pfVar16 + 5);
          *(undefined8 *)peVar14->pad = *(undefined8 *)(pfVar16 + 3);
          *(undefined8 *)((long)&peVar14->packed_data + 4) = uVar1;
          goto LAB_0011678c;
        case EXR_ATTR_M33F:
          peVar14 = (exr_attr_opaquedata_t *)(local_e8->field_6).m33f;
          pfVar16 = (float *)puVar15[3];
          *(float *)&peVar14->unpack_func_ptr = pfVar16[8];
LAB_00116781:
          fVar21 = *pfVar16;
          fVar22 = pfVar16[1];
          fVar23 = pfVar16[2];
          fVar24 = pfVar16[3];
          fVar25 = pfVar16[4];
          fVar26 = pfVar16[5];
          fVar27 = pfVar16[6];
          fVar28 = pfVar16[7];
LAB_00116788:
          *(float *)&peVar14->packed_data = fVar25;
          *(float *)((long)&peVar14->packed_data + 4) = fVar26;
          *(float *)&peVar14->unpacked_data = fVar27;
          *(float *)((long)&peVar14->unpacked_data + 4) = fVar28;
          goto LAB_0011678c;
        case EXR_ATTR_M33D:
          __dest = (local_e8->field_6).box2i;
          __src = (void *)puVar15[3];
          __n = 0x48;
          goto LAB_0011668e;
        case EXR_ATTR_M44F:
          peVar14 = (exr_attr_opaquedata_t *)(local_e8->field_6).m33d;
          pfVar16 = (float *)puVar15[3];
          fVar21 = *pfVar16;
          fVar22 = pfVar16[1];
          fVar23 = pfVar16[2];
          fVar24 = pfVar16[3];
          fVar25 = pfVar16[4];
          fVar26 = pfVar16[5];
          fVar27 = pfVar16[6];
          fVar28 = pfVar16[7];
          p_Var4 = *(_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr **)
                    (pfVar16 + 8);
          p_Var5 = *(_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr **)
                    (pfVar16 + 10);
          fVar6 = pfVar16[0xe];
          fVar7 = pfVar16[0xf];
          peVar14->destroy_unpacked_func_ptr =
               *(_func_void_exr_context_t_void_ptr_int32_t **)(pfVar16 + 0xc);
          peVar14[1].size = (int32_t)fVar6;
          peVar14[1].unpacked_size = (int32_t)fVar7;
          peVar14->unpack_func_ptr = p_Var4;
          peVar14->pack_func_ptr = p_Var5;
          goto LAB_00116788;
        case EXR_ATTR_M44D:
          __dest = (local_e8->field_6).box2i;
          __src = (void *)puVar15[3];
          __n = 0x80;
LAB_0011668e:
          memcpy(__dest,__src,__n);
          break;
        case EXR_ATTR_PREVIEW:
          puVar2 = (uint32_t *)puVar15[3];
          eVar10 = exr_attr_preview_create
                             (ctxt,(local_e8->field_6).preview,*puVar2,puVar2[1],
                              *(uint8_t **)(puVar2 + 4));
          goto LAB_00116819;
        case EXR_ATTR_RATIONAL:
        case EXR_ATTR_TIMECODE:
        case EXR_ATTR_V2I:
        case EXR_ATTR_V2F:
          peVar13 = (exr_attr_chromaticities_t *)(local_e8->field_6).box2i;
          puVar15 = (undefined8 *)puVar15[3];
          goto LAB_001166d9;
        case EXR_ATTR_STRING:
          eVar10 = exr_attr_string_create_with_length
                             (ctxt,(local_e8->field_6).string,*(char **)((int32_t *)puVar15[3] + 2),
                              *(int32_t *)puVar15[3]);
          goto LAB_00116819;
        case EXR_ATTR_STRING_VECTOR:
          eVar10 = exr_attr_string_vector_copy
                             (ctxt,(local_e8->field_6).stringvector,
                              (exr_attr_string_vector_t *)puVar15[3]);
          goto LAB_00116819;
        case EXR_ATTR_TILEDESC:
          peVar13 = (exr_attr_chromaticities_t *)(local_e8->field_6).tiledesc;
          puVar15 = (undefined8 *)puVar15[3];
          *(undefined1 *)&((exr_attr_v2i_t *)&peVar13->green_x)->field_0 =
               *(undefined1 *)(puVar15 + 1);
          goto LAB_001166d9;
        case EXR_ATTR_V3I:
        case EXR_ATTR_V3F:
          peVar13 = (local_e8->field_6).chromaticities;
          puVar15 = (undefined8 *)puVar15[3];
          (((exr_attr_v2i_t *)&peVar13->green_x)->field_0).field_0.x = *(int32_t *)(puVar15 + 1);
LAB_001166d9:
          uVar1 = *puVar15;
          peVar13->red_x = (float)(int)uVar1;
          peVar13->red_y = (float)(int)((ulong)uVar1 >> 0x20);
          break;
        case EXR_ATTR_V3D:
          peVar14 = (local_e8->field_6).opaque;
          pfVar16 = (float *)puVar15[3];
          peVar14->packed_data = *(void **)(pfVar16 + 4);
LAB_00116660:
          fVar21 = *pfVar16;
          fVar22 = pfVar16[1];
          fVar23 = pfVar16[2];
          fVar24 = pfVar16[3];
LAB_0011678c:
          peVar14->size = (int32_t)fVar21;
          peVar14->unpacked_size = (int32_t)fVar22;
          peVar14->packed_alloc_size = (int32_t)fVar23;
          *(float *)peVar14->pad = fVar24;
          break;
        case EXR_ATTR_OPAQUE:
          eVar10 = exr_attr_opaquedata_copy
                             (ctxt,(local_e8->field_6).opaque,(exr_attr_opaquedata_t *)puVar15[3]);
          goto LAB_00116819;
        default:
          eVar10 = (**(code **)(ctxt + 0x38))(ctxt,0xe);
LAB_00116819:
          if (eVar10 == 0) break;
          exr_attr_list_remove(ctxt,local_d8,local_e8);
          goto LAB_0011683d;
        }
        eVar10 = 0;
LAB_0011683d:
        lVar20 = lVar20 + 1;
      } while (eVar10 == 0);
      if (local_cc != 0) {
        eVar10 = internal_exr_compute_tile_information((_internal_exr_context *)ctxt,local_b8,1);
      }
    }
  }
  return eVar10;
}

Assistant:

exr_result_t
exr_copy_unset_attributes (
    exr_context_t       ctxt,
    int                 part_index,
    exr_const_context_t source,
    int                 src_part_index)
{
    exr_result_t                        rv;
    const struct _internal_exr_context* srcctxt = EXR_CCTXT (source);
    struct _internal_exr_part*          srcpart;
    int                                 update_tiles = 0;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!srcctxt)
        return EXR_UNLOCK_AND_RETURN_PCTXT (EXR_ERR_MISSING_CONTEXT_ARG);
    if (srcctxt != pctxt) EXR_LOCK (srcctxt);

    if (src_part_index < 0 || src_part_index >= srcctxt->num_parts)
    {
        if (srcctxt != pctxt) EXR_UNLOCK (srcctxt);
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Source part index (%d) out of range",
            src_part_index));
    }

    srcpart = srcctxt->parts[src_part_index];

    rv = EXR_ERR_SUCCESS;
    for (int a = 0;
         rv == EXR_ERR_SUCCESS && a < srcpart->attributes.num_attributes;
         ++a)
    {
        const exr_attribute_t* srca = srcpart->attributes.entries[a];
        exr_attribute_t*       attr = NULL;

        rv = exr_attr_list_find_by_name (
            ctxt,
            (exr_attribute_list_t*) &(part->attributes),
            srca->name,
            &attr);
        if (rv == EXR_ERR_NO_ATTR_BY_NAME)
        {
            rv = copy_attr (ctxt, pctxt, part, srca, &update_tiles);
        }
        else
        {
            rv = EXR_ERR_SUCCESS;
        }
    }

    if (update_tiles)
        rv = internal_exr_compute_tile_information (pctxt, part, 1);

    if (srcctxt != pctxt) EXR_UNLOCK (srcctxt);
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}